

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

size_t __thiscall
kws::Parser::FindConstructor
          (Parser *this,string *buffer,string *className,bool headerfile,size_t startPos)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  char *__end;
  ulong uVar7;
  string localconstructor;
  string constructor;
  ulong local_a8;
  char *local_98;
  char *local_90;
  char local_88 [16];
  ulong local_78;
  char *local_70;
  char *local_68;
  char local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70);
  pcVar6 = ":";
  if ((int)CONCAT71(in_register_00000009,headerfile) != 0) {
    pcVar6 = " ";
  }
  std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,(ulong)pcVar6);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)(className->_M_dataplus)._M_p);
  pcVar6 = local_70;
  strlen(local_70);
  uVar3 = std::__cxx11::string::find((char *)buffer,(ulong)pcVar6,startPos);
  uVar4 = std::__cxx11::string::find((char *)buffer,0x177d62,uVar3);
  local_a8 = std::__cxx11::string::find((char *)buffer,0x16a9d1,uVar4);
  uVar7 = 0xffffffffffffffff;
  if (((local_a8 != 0xffffffffffffffff) && (uVar4 != 0xffffffffffffffff)) &&
     (uVar3 != 0xffffffffffffffff)) {
    pcVar6 = ":";
    if (headerfile) {
      pcVar6 = " ";
    }
    while( true ) {
      std::__cxx11::string::substr((ulong)&local_98,(ulong)buffer);
      pcVar5 = local_90 + 1;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        pcVar5 = pcVar5 + -1;
        bVar1 = false;
      } while (pcVar5 != (char *)0x0);
      if (bVar2) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)buffer);
        std::__cxx11::string::operator=((string *)&local_98,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        pcVar5 = local_90 + 1;
        bVar2 = true;
        do {
          bVar1 = bVar2;
          pcVar5 = pcVar5 + -1;
          bVar2 = false;
        } while (pcVar5 != (char *)0x0);
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
        uVar7 = std::__cxx11::string::find((char *)buffer,0x177d56,local_a8);
        local_78 = std::__cxx11::string::find((char *)buffer,0x16acee,local_a8);
        if (uVar7 <= local_78) {
          local_78 = 0xffffffffffffffff;
        }
      }
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      uVar7 = local_78;
      if (bVar1) break;
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"","");
      std::__cxx11::string::_M_replace((ulong)&local_98,0,local_90,(ulong)pcVar6);
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)(className->_M_dataplus)._M_p);
      pcVar5 = local_98;
      strlen(local_98);
      uVar3 = std::__cxx11::string::find((char *)buffer,(ulong)pcVar5,uVar3 + 1);
      uVar4 = std::__cxx11::string::find((char *)buffer,0x177d62,uVar3);
      local_a8 = std::__cxx11::string::find((char *)buffer,0x16a9d1,uVar4);
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      uVar7 = 0xffffffffffffffff;
      if (((local_a8 == 0xffffffffffffffff) || (uVar4 == 0xffffffffffffffff)) ||
         (uVar3 == 0xffffffffffffffff)) break;
    }
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return uVar7;
}

Assistant:

size_t Parser::FindConstructor(const std::string & buffer, const std::string & className,
                               bool headerfile, size_t startPos) const
{
  std::string constructor = "";

  if(headerfile)
    {
    constructor = " ";
    }
  else
    {
    constructor = ":";
    }
  constructor += className;
  size_t pos = buffer.find(constructor.c_str(),startPos);
  size_t pos2 = buffer.find("(",pos);
  size_t pos3 = buffer.find(")",pos2);

  // if it's not the destructor ...
  /*std::string dest = "~";
  dest += className;
  long destructor = buffer.find(dest.c_str(),0);*/
  while(pos != std::string::npos && pos2 != std::string::npos && pos3 != std::string::npos)
    {
    //if(pos != destructor+1) // we have the constructor
      {
      // we look if we have only spaces or \n between pos pos2 and pos3
      std::string val = buffer.substr(pos+className.size()+1,pos2-pos-className.size()-1);
      bool ok = true;
      for (char i : val) {
        if (i != ' ' || i != '\n') {
          ok =false;
        }
      }

      bool ok2 = false;
      if(ok)
        {
        ok2 = true;
        val = buffer.substr(pos2+1,pos3-pos2-1);
        for (char i : val) {
          if (i != ' ' || i != '\n') {
            ok2 =false;
          }
        }
        }

      // if ok2 then we check if the constructor is implemented
      if(ok2)
        {
        size_t pos4 = buffer.find(";",pos3);
        size_t pos5 = buffer.find("{",pos3);

        if(pos5<pos4)
          {
          return pos5;
          }
	return std::string::npos;
        }
      }
    std::string localconstructor = "";
    if(headerfile)
      {
      localconstructor = " ";
      }
    else
      {
      localconstructor = ":";
      }
    localconstructor += className;
    pos = buffer.find(localconstructor.c_str(),pos+1);
    pos2 = buffer.find("(",pos);
    pos3 = buffer.find(")",pos2);
    }

  return std::string::npos;
}